

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::bounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  QTriangulator<unsigned_short> *pQVar2;
  Edge *pEVar3;
  QPodPoint *pQVar4;
  Node *pNVar5;
  QRBTree<int> *pQVar6;
  qint64 qVar7;
  Node **ppNVar8;
  Node *pNVar9;
  Node *pNVar10;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar11;
  
  pQVar6 = &this->m_edgeList;
  pQVar2 = this->m_parent;
  pEVar3 = (this->m_edges).buffer;
  pNVar9 = (Node *)0x0;
  do {
    pNVar10 = pQVar6->root;
    if (pNVar10 == (Node *)0x0) {
      pNVar10 = (Node *)0x0;
LAB_003e8449:
      pVar11.second = pNVar10;
      pVar11.first = pNVar9;
      return pVar11;
    }
    iVar1 = pNVar10->data;
    pQVar4 = (pQVar2->m_vertices).buffer;
    qVar7 = qPointDistanceFromLine
                      (point,pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                       pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
    if (qVar7 == 0) {
      ppNVar8 = &pNVar10->left;
      pNVar9 = pNVar10;
      while (pNVar5 = *ppNVar8, pNVar5 != (Node *)0x0) {
        iVar1 = pNVar5->data;
        qVar7 = qPointDistanceFromLine
                          (point,pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                           pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
        if (qVar7 == 0) {
          pNVar9 = pNVar5;
        }
        ppNVar8 = &pNVar5->left + (qVar7 != 0);
      }
      ppNVar8 = &pNVar10->right;
      while (pNVar5 = *ppNVar8, pNVar5 != (Node *)0x0) {
        iVar1 = pNVar5->data;
        qVar7 = qPointDistanceFromLine
                          (point,pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                           pQVar4 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
        if (qVar7 == 0) {
          pNVar10 = pNVar5;
        }
        ppNVar8 = &pNVar5->left + (qVar7 == 0);
      }
      goto LAB_003e8449;
    }
    pQVar6 = (QRBTree<int> *)(&pNVar10->left + (-1 < qVar7));
  } while( true );
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::bounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0) {
            result.first = result.second = current;
            break;
        }
        current = (d < 0 ? current->left : current->right);
    }
    if (current == nullptr)
        return result;

    current = result.first->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            result.first = current;
            current = current->left;
        } else {
            current = current->right;
        }
    }

    current = result.second->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            result.second = current;
            current = current->right;
        } else {
            current = current->left;
        }
    }

    return result;
}